

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

bool __thiscall
DynamicGraph::bdbfsStep
          (DynamicGraph *this,list<unsigned_long,_std::allocator<unsigned_long>_> *queue,
          vector<bool,_std::allocator<bool>_> *visitedV,
          vector<bool,_std::allocator<bool>_> *visitedU,
          list<unsigned_long,_std::allocator<unsigned_long>_> *visitedList)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  ulong *puVar3;
  pointer psVar4;
  pointer psVar5;
  _Base_ptr p_Var6;
  byte bVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _Base_ptr p_Var10;
  long lVar11;
  _Rb_tree_header *p_Var12;
  pointer psVar13;
  _List_node_base *p_Var14;
  ulong uVar15;
  AdjList *g;
  bool bVar16;
  
  p_Var14 = (queue->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node
            .super__List_node_base._M_next;
  p_Var9 = p_Var14[1]._M_next;
  p_Var8 = (_List_node_base *)((long)(p_Var9 + 3) + 0xf);
  if (-1 < (long)p_Var9) {
    p_Var8 = p_Var9;
  }
  puVar3 = (visitedV->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)p_Var8 >> 6) +
           (ulong)(((ulong)p_Var9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar3 = *puVar3 | 1L << ((byte)p_Var9 & 0x3f);
  psVar1 = &(queue->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl._M_node
            ._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var14,0x18);
  psVar4 = (this->super_UndirectedGraph).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar13 = *(pointer *)
             &psVar4[(long)p_Var9].super_StoredVertex.m_out_edges.
              super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
  ;
  psVar5 = *(pointer *)
            ((long)&psVar4[(long)p_Var9].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>
            + 8);
  bVar16 = psVar13 == psVar5;
  if (!bVar16) {
    p_Var14 = (_List_node_base *)(psVar13->super_stored_edge<unsigned_long>).m_target;
    p_Var9 = (_List_node_base *)((long)&p_Var14[3]._M_prev + 7);
    if (-1 < (long)p_Var14) {
      p_Var9 = p_Var14;
    }
    lVar11 = (long)p_Var9 >> 6;
    uVar15 = (ulong)(((ulong)p_Var14 & 0x800000000000003f) < 0x8000000000000001);
    bVar7 = (byte)p_Var14;
    if (((visitedU->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[lVar11 + uVar15 + 0xffffffffffffffff] >>
         ((ulong)p_Var14 & 0x3f) & 1) == 0) {
      p_Var2 = &(this->virtualEdges)._M_t._M_impl.super__Rb_tree_header;
      do {
        if (((visitedV->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p[lVar11 + uVar15 + 0xffffffffffffffff] &
            1L << (bVar7 & 0x3f)) == 0) {
          p_Var9 = (psVar13->m_iter)._M_node + 2;
          p_Var6 = (this->virtualEdges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var2->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(_List_node_base **)((long)(p_Var6 + 1) + 0x10) < p_Var9]
              ) {
            if (*(_List_node_base **)((long)(p_Var6 + 1) + 0x10) >= p_Var9) {
              p_Var10 = p_Var6;
            }
          }
          p_Var12 = p_Var2;
          if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
             (p_Var12 = (_Rb_tree_header *)p_Var10,
             p_Var9 < *(_List_node_base **)((undefined1 *)((long)p_Var10 + 0x28) + 8))) {
            p_Var12 = p_Var2;
          }
          if (p_Var12 == p_Var2) {
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = p_Var14;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar1 = &(queue->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = p_Var14;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar1 = &(visitedList->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
          }
        }
        psVar13 = psVar13 + 1;
        bVar16 = psVar13 == psVar5;
        if (bVar16) {
          return bVar16;
        }
        p_Var14 = (_List_node_base *)(psVar13->super_stored_edge<unsigned_long>).m_target;
        p_Var9 = (_List_node_base *)((long)&p_Var14[3]._M_prev + 7);
        if (-1 < (long)p_Var14) {
          p_Var9 = p_Var14;
        }
        lVar11 = (long)p_Var9 >> 6;
        uVar15 = (ulong)(((ulong)p_Var14 & 0x800000000000003f) < 0x8000000000000001);
        bVar7 = (byte)p_Var14;
      } while (((visitedU->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [lVar11 + uVar15 + 0xffffffffffffffff] >> ((ulong)p_Var14 & 0x3f) & 1) == 0);
    }
  }
  return bVar16;
}

Assistant:

bool DynamicGraph::bdbfsStep(std::list<Vertex>& queue, std::vector<bool>& visitedV,
               std::vector<bool>& visitedU, std::list<Vertex>& visitedList)
{
    Vertex vv = queue.front();
    visitedV[vv]=true;
    queue.pop_front();

    OutEdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = out_edges(vv, *this); ei != ei_end; ++ei) {
        Vertex vvTarget = target(*ei, *this);
        if (visitedU[vvTarget]) {
            return false;
        }
        if(!visitedV[vvTarget] && !virtualEdges.count(*ei)){
            queue.push_back(vvTarget);
            visitedList.push_back(vvTarget);
        }
    }
    return true;
}